

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

bool __thiscall QCompletionModel::hasChildren(QCompletionModel *this,QModelIndex *parent)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined1 local_40 [24];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  bVar3 = QModelIndex::isValid(parent);
  if (bVar3) {
    uVar4 = 0;
  }
  else if (this->showAll == true) {
    QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
    ::value((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             *)(lVar1 + 0xd8));
    plVar2 = *(long **)(lVar1 + 0xd8);
    (**(code **)(*(long *)this + 400))(local_40,this,parent);
    uVar4 = (**(code **)(*plVar2 + 0x88))(plVar2,local_40);
  }
  else {
    iVar5 = QCompletionEngine::matchCount((this->engine).d);
    uVar4 = iVar5 != 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QCompletionModel::hasChildren(const QModelIndex &parent) const
{
    Q_D(const QCompletionModel);
    if (parent.isValid())
        return false;

    if (showAll)
        return d->model->hasChildren(mapToSource(parent));

    if (!engine->matchCount())
        return false;

    return true;
}